

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_ParseEmptyStringFromWire_Test::
NoFieldPresenceTest_ParseEmptyStringFromWire_Test
          (NoFieldPresenceTest_ParseEmptyStringFromWire_Test *this)

{
  NoFieldPresenceTest_ParseEmptyStringFromWire_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__NoFieldPresenceTest_ParseEmptyStringFromWire_Test_029e16b0;
  return;
}

Assistant:

TEST(NoFieldPresenceTest, ParseEmptyStringFromWire) {
  ASSERT_EQ(TestAllTypes::GetDescriptor()->FindFieldByNumber(15)->name(),
            "optional_bytes");

  // Input wire tag: 0172 (octal) which is 01 111 010
  //   Field number 15 with wire type LEN
  // Explicitly specify LEN to be zero, then it's basically an empty string
  //   encoded on the wire.
  absl::string_view wire("\172\x00",  // 3:LEN 0
                         2);

  TestAllTypes message;
  message.MergeFromString(wire);

  // Implicit-presence fields don't have hazzers, so we can only verify that the
  // empty bytes field is not overwritten.
  EXPECT_THAT(message.optional_bytes(), IsEmpty());

  std::string output_data;
  EXPECT_TRUE(message.SerializeToString(&output_data));
  EXPECT_THAT(output_data, IsEmpty());
}